

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::recoverdelaunay(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  tetgenbehavior *ptVar6;
  ulong uVar7;
  int iVar8;
  tetrahedron *pppdVar9;
  arraypool *paVar10;
  arraypool *this_00;
  long lVar11;
  arraypool *paVar12;
  char *pcVar13;
  char *pcVar14;
  long *plVar15;
  long lVar16;
  tetgenmesh *this_01;
  badface **fstack;
  long lVar17;
  triface *ptVar18;
  byte bVar19;
  double dVar20;
  flipconstraints fc;
  triface local_d0;
  badface **local_c0;
  arraypool *local_b8;
  long local_b0;
  flipconstraints local_a8;
  
  bVar19 = 0;
  local_d0.tet = (tetrahedron *)0x0;
  local_d0.ver = 0;
  local_a8.seg[0] = (point)0x0;
  local_a8.fac[0] = (point)0x0;
  local_a8.remvert = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8.tetprism_vol_sum._4_4_ = 0;
  local_a8.remove_large_angle = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 0;
  if (this->b->quiet == 0) {
    puts("Recovering Delaunayness...");
  }
  this->tetprism_vol_sum = 0.0;
  pmVar4 = this->tetrahedrons;
  ppvVar5 = pmVar4->firstblock;
  pmVar4->pathblock = ppvVar5;
  pmVar4->pathitem =
       (void *)((long)ppvVar5 +
               (((long)pmVar4->alignbytes + 8U) -
               (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
  pmVar4->pathitemsleft = pmVar4->itemsperblock;
  this_01 = this;
  pppdVar9 = tetrahedrontraverse(this);
  local_d0.tet = pppdVar9;
  if (pppdVar9 != (tetrahedron *)0x0) {
    do {
      local_d0.ver = 0;
      lVar17 = 0;
      local_d0.tet = pppdVar9;
      do {
        if ((*(uint *)(((ulong)pppdVar9[lVar17] & 0xfffffffffffffff0) +
                      (long)this->elemmarkerindex * 4) >> ((byte)pppdVar9[lVar17] & 3) & 4) == 0) {
          this_01 = this;
          flippush(this,&this->flipstack,&local_d0);
        }
        lVar17 = lVar17 + 1;
        local_d0.ver = (int)lVar17;
      } while (lVar17 != 4);
      dVar20 = tetprismvol(this_01,(double *)pppdVar9[4],(double *)pppdVar9[5],(double *)pppdVar9[6]
                           ,(double *)pppdVar9[7]);
      this->tetprism_vol_sum = dVar20 + this->tetprism_vol_sum;
      this_01 = this;
      pppdVar9 = tetrahedrontraverse(this);
      local_d0.tet = pppdVar9;
    } while (pppdVar9 != (tetrahedron *)0x0);
  }
  local_a8.bak_tetprism_vol = this->b->epsilon * this->tetprism_vol_sum * 0.001;
  if (this->b->verbose != 0) {
    printf("  Initial obj = %.17g\n");
  }
  if (1 < this->b->verbose) {
    printf("    Recover Delaunay [Lawson] : %ld\n",this->flippool->items);
  }
  local_a8.remove_ndelaunay_edge = 1;
  local_a8.enqflag = 2;
  lawsonflip3d(this,&local_a8);
  if (1 < this->b->verbose) {
    printf("    obj (after Lawson) = %.17g\n",this->tetprism_vol_sum);
  }
  paVar12 = this->unflipqueue;
  if (paVar12->objects != 0) {
    local_a8.unflip = 1;
    local_a8.collectnewtets = 1;
    local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
    this->autofliplinklevel = 1;
    ptVar6 = this->b;
    ptVar6->fliplinklevel = -1;
    iVar1 = ptVar6->flipstarsize;
    ptVar6->flipstarsize = 10;
    paVar10 = (arraypool *)operator_new(0x30);
    paVar10->objectbytes = 0x88;
    paVar10->objectsperblock = 0x400;
    paVar10->log2objectsperblock = 10;
    paVar10->objectsperblockmark = 0x3ff;
    paVar10->toparraylen = 0;
    paVar10->toparray = (char **)0x0;
    paVar10->objects = 0;
    paVar10->totalmemory = 0;
    this_00 = (arraypool *)operator_new(0x30);
    this_00->objectbytes = 0x88;
    this_00->objectsperblock = 0x400;
    this_00->log2objectsperblock = 10;
    this_00->objectsperblockmark = 0x3ff;
    this_00->toparraylen = 0;
    this_00->toparray = (char **)0x0;
    this_00->objects = 0;
    this_00->totalmemory = 0;
    this->unflipqueue = paVar10;
    if (0 < paVar12->objects) {
      fstack = &this->flipstack;
      paVar10 = this_00;
      local_c0 = fstack;
      do {
        this_00 = paVar12;
        plVar15 = &this_00->objects;
        if (1 < this->b->verbose) {
          printf("    Recover Delaunay [level = %2d] #:  %ld.\n");
        }
        paVar12 = paVar10;
        if (0 < *plVar15) {
          lVar17 = 0;
          local_b8 = paVar10;
          do {
            pcVar14 = this_00->toparray[(uint)lVar17 >> ((byte)this_00->log2objectsperblock & 0x1f)]
            ;
            lVar16 = (long)this_00->objectbytes *
                     (long)(int)(this_00->objectsperblockmark & (uint)lVar17);
            ptVar18 = (triface *)(pcVar14 + lVar16);
            local_b0 = lVar17;
            iVar8 = getedge(this,*(point *)(pcVar14 + lVar16 + 0x58),
                            *(point *)(pcVar14 + lVar16 + 0x60),ptVar18);
            if (iVar8 != 0) {
              iVar8 = removeedgebyflips(this,ptVar18,&local_a8);
              if (iVar8 == 2) {
                this->tetprism_vol_sum =
                     (double)CONCAT44(local_a8.tetprism_vol_sum._4_4_,
                                      local_a8.tetprism_vol_sum._0_4_) + this->tetprism_vol_sum;
                local_a8.tetprism_vol_sum._0_4_ = 0;
                local_a8.tetprism_vol_sum._4_4_ = 0;
                paVar12 = this->cavetetlist;
                if (0 < paVar12->objects) {
                  lVar17 = 0;
                  do {
                    lVar11 = (long)paVar12->objectbytes *
                             (long)(int)(paVar12->objectsperblockmark & (uint)lVar17);
                    lVar16 = *(long *)(paVar12->toparray
                                       [(uint)lVar17 >> ((byte)paVar12->log2objectsperblock & 0x1f)]
                                      + lVar11);
                    if ((lVar16 != 0) && (*(long *)(lVar16 + 0x20) != 0)) {
                      ptVar18 = (triface *)
                                (paVar12->toparray
                                 [(uint)lVar17 >> ((byte)paVar12->log2objectsperblock & 0x1f)] +
                                lVar11);
                      ptVar18->ver = 0;
                      iVar8 = 0;
                      do {
                        if ((*(uint *)(((ulong)ptVar18->tet[iVar8] & 0xfffffffffffffff0) +
                                      (long)this->elemmarkerindex * 4) >>
                             ((byte)ptVar18->tet[iVar8] & 3) & 4) == 0) {
                          flippush(this,fstack,ptVar18);
                        }
                        iVar2 = ptVar18->ver;
                        iVar8 = iVar2 + 1;
                        ptVar18->ver = iVar8;
                      } while (iVar2 < 3);
                    }
                    lVar17 = lVar17 + 1;
                    paVar12 = this->cavetetlist;
                  } while (lVar17 < paVar12->objects);
                }
                paVar12->objects = 0;
                local_a8.enqflag = 2;
                lawsonflip3d(this,&local_a8);
                local_a8._0_8_ = (ulong)(uint)local_a8.chkencflag << 0x20;
                paVar12 = this->unflipqueue;
                if (0 < paVar12->objects) {
                  lVar17 = 0;
                  do {
                    pcVar14 = paVar12->toparray
                              [(uint)lVar17 >> ((byte)paVar12->log2objectsperblock & 0x1f)];
                    uVar3 = paVar12->objectsperblockmark;
                    iVar8 = paVar12->objectbytes;
                    pcVar13 = arraypool::getblock(this_00,(int)*plVar15);
                    uVar7 = *plVar15;
                    *plVar15 = uVar7 + 1;
                    pcVar14 = pcVar14 + (long)iVar8 * (long)(int)(uVar3 & (uint)lVar17);
                    pcVar13 = pcVar13 + (long)this_00->objectbytes *
                                        ((long)this_00->objectsperblock - 1U & uVar7);
                    *(undefined8 *)pcVar13 = *(undefined8 *)pcVar14;
                    *(undefined4 *)(pcVar13 + 8) = *(undefined4 *)(pcVar14 + 8);
                    *(undefined8 *)(pcVar13 + 0x10) = *(undefined8 *)(pcVar14 + 0x10);
                    *(undefined4 *)(pcVar13 + 0x18) = *(undefined4 *)(pcVar14 + 0x18);
                    pcVar14 = pcVar14 + 0x20;
                    pcVar13 = pcVar13 + 0x20;
                    for (lVar16 = 0xd; lVar16 != 0; lVar16 = lVar16 + -1) {
                      *(undefined8 *)pcVar13 = *(undefined8 *)pcVar14;
                      pcVar14 = pcVar14 + (ulong)bVar19 * -0x10 + 8;
                      pcVar13 = pcVar13 + (ulong)bVar19 * -0x10 + 8;
                    }
                    lVar17 = lVar17 + 1;
                    paVar12 = this->unflipqueue;
                  } while (lVar17 < paVar12->objects);
                }
                paVar12->objects = 0;
                fstack = local_c0;
                paVar12 = local_b8;
              }
              else {
                pcVar14 = arraypool::getblock(paVar12,(int)paVar12->objects);
                uVar7 = paVar12->objects;
                paVar12->objects = uVar7 + 1;
                pcVar14 = pcVar14 + (long)paVar12->objectbytes *
                                    ((long)paVar12->objectsperblock - 1U & uVar7);
                *(tetrahedron **)pcVar14 = ptVar18->tet;
                *(int *)(pcVar14 + 8) = ptVar18->ver;
                *(tetrahedron **)(pcVar14 + 0x10) = ptVar18[1].tet;
                *(int *)(pcVar14 + 0x18) = ptVar18[1].ver;
                ptVar18 = ptVar18 + 2;
                pcVar14 = pcVar14 + 0x20;
                for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
                  *(tetrahedron **)pcVar14 = ptVar18->tet;
                  ptVar18 = (triface *)&ptVar18[-(ulong)bVar19].ver;
                  pcVar14 = pcVar14 + (ulong)bVar19 * -0x10 + 8;
                }
                local_a8.tetprism_vol_sum._0_4_ = 0;
                local_a8.tetprism_vol_sum._4_4_ = 0;
              }
            }
            lVar17 = local_b0 + 1;
          } while (lVar17 < *plVar15);
        }
        if (1 < this->b->verbose) {
          printf("    obj (after level %d) = %.17g.\n",this->tetprism_vol_sum);
        }
        *plVar15 = 0;
        if (0 < paVar12->objects) {
          if (this->b->delmaxfliplevel <= this->autofliplinklevel) break;
          this->autofliplinklevel = this->autofliplinklevel + this->b->fliplinklevelinc;
        }
        paVar10 = this_00;
      } while (0 < paVar12->objects);
    }
    if ((0 < paVar12->objects) && (1 < this->b->verbose)) {
      printf("    %ld non-Delaunay edges remained.\n");
    }
    if (this->b->verbose != 0) {
      printf("  Final obj  = %.17g\n",this->tetprism_vol_sum);
    }
    this->b->flipstarsize = iVar1;
    if (paVar12 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar12);
      operator_delete(paVar12,0x30);
    }
    arraypool::~arraypool(this_00);
    operator_delete(this_00,0x30);
  }
  return;
}

Assistant:

void tetgenmesh::recoverdelaunay()
{
  arraypool *flipqueue, *nextflipqueue, *swapqueue;
  triface tetloop, neightet, *parytet;
  badface *bface, *parybface;
  point *ppt;
  flipconstraints fc;
  int i, j;

  if (!b->quiet) {
    printf("Recovering Delaunayness...\n");
  }

  tetprism_vol_sum = 0.0; // Initialize it.

  // Put all interior faces of the mesh into 'flipstack'.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != NULL) {
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      decode(tetloop.tet[tetloop.ver], neightet);
      if (!facemarked(neightet)) {
        flippush(flipstack, &tetloop);
      }
    }
    ppt = (point *) &(tetloop.tet[4]);
    tetprism_vol_sum += tetprismvol(ppt[0], ppt[1], ppt[2], ppt[3]);
    tetloop.tet = tetrahedrontraverse();
  }

  // Calulate a relatively lower bound for small improvement. 
  //   Used to avoid rounding error in volume calculation.
  fc.bak_tetprism_vol = tetprism_vol_sum * b->epsilon * 1e-3;

  if (b->verbose) {
    printf("  Initial obj = %.17g\n", tetprism_vol_sum);
  }

  if (b->verbose > 1) {
    printf("    Recover Delaunay [Lawson] : %ld\n", flippool->items);
  }

  // First only use the basic Lawson's flip.
  fc.remove_ndelaunay_edge = 1;
  fc.enqflag = 2;

  lawsonflip3d(&fc);

  if (b->verbose > 1) {
    printf("    obj (after Lawson) = %.17g\n", tetprism_vol_sum);
  }

  if (unflipqueue->objects == 0l) {
    return; // The mesh is Delaunay.
  }

  fc.unflip = 1; // Unflip if the edge is not flipped.
  fc.collectnewtets = 1; // new tets are returned in 'cavetetlist'.
  fc.enqflag = 0;

  autofliplinklevel = 1; // Init level.
  b->fliplinklevel = -1; // No fixed level.

  // For efficiency reason, we limit the maximium size of the edge star.
  int bakmaxflipstarsize = b->flipstarsize;
  b->flipstarsize = 10; // default

  flipqueue = new arraypool(sizeof(badface), 10);
  nextflipqueue = new arraypool(sizeof(badface), 10);
  
  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  while (flipqueue->objects > 0l) {

    if (b->verbose > 1) {
      printf("    Recover Delaunay [level = %2d] #:  %ld.\n",
             autofliplinklevel, flipqueue->objects);
    }

    for (i = 0; i < flipqueue->objects; i++) {
      bface  = (badface *) fastlookup(flipqueue, i);
      if (getedge(bface->forg, bface->fdest, &bface->tt)) {
        if (removeedgebyflips(&(bface->tt), &fc) == 2) {
          tetprism_vol_sum += fc.tetprism_vol_sum;
          fc.tetprism_vol_sum = 0.0; // Clear it.
          // Queue new faces for flips.
          for (j = 0; j < cavetetlist->objects; j++) {
            parytet = (triface *) fastlookup(cavetetlist, j);
            // A queued new tet may be dead.
            if (!isdeadtet(*parytet)) {
              for (parytet->ver = 0; parytet->ver < 4; parytet->ver++) {
                // Avoid queue a face twice.
                decode(parytet->tet[parytet->ver], neightet);
                if (!facemarked(neightet)) {
                  flippush(flipstack, parytet);
                }
              } // parytet->ver
            }
          } // j
          cavetetlist->restart();
          // Remove locally non-Delaunay faces. New non-Delaunay edges
          //   may be found. They are saved in 'unflipqueue'.
          fc.enqflag = 2;
          lawsonflip3d(&fc);
          fc.enqflag = 0;
          // There may be unflipable faces. Add them in flipqueue.
          for (j = 0; j < unflipqueue->objects; j++) {
            bface  = (badface *) fastlookup(unflipqueue, j);
            flipqueue->newindex((void **) &parybface);
            *parybface = *bface;
          }
          unflipqueue->restart();
        } else {
          // Unable to remove this edge. Save it.
          nextflipqueue->newindex((void **) &parybface);
          *parybface = *bface;
          // Normally, it should be zero. 
          //assert(fc.tetprism_vol_sum == 0.0);
          // However, due to rounding errors, a tiny value may appear.
          fc.tetprism_vol_sum = 0.0;
        }
      }
    } // i

    if (b->verbose > 1) {
      printf("    obj (after level %d) = %.17g.\n", autofliplinklevel,
             tetprism_vol_sum);
    }
    flipqueue->restart();

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = nextflipqueue;
    nextflipqueue = swapqueue;

    if (flipqueue->objects > 0l) {
      // default 'b->delmaxfliplevel' is 1.
      if (autofliplinklevel >= b->delmaxfliplevel) {
        // For efficiency reason, we do not search too far.
        break;
      }
      autofliplinklevel+=b->fliplinklevelinc;
    }
  } // while (flipqueue->objects > 0l)

  if (flipqueue->objects > 0l) {
    if (b->verbose > 1) {
      printf("    %ld non-Delaunay edges remained.\n", flipqueue->objects);
    }
  }

  if (b->verbose) {
    printf("  Final obj  = %.17g\n", tetprism_vol_sum);
  }

  b->flipstarsize = bakmaxflipstarsize;
  delete flipqueue;
  delete nextflipqueue;
}